

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallCommandArguments.cxx
# Opt level: O3

void __thiscall
cmInstallCommandFileSetArguments::cmInstallCommandFileSetArguments
          (cmInstallCommandFileSetArguments *this,string *defaultComponent)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  static_string_view name;
  string local_40;
  
  local_40._M_dataplus._M_p = (defaultComponent->_M_dataplus)._M_p;
  paVar1 = &defaultComponent->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p == paVar1) {
    local_40.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_40.field_2._8_8_ = *(undefined8 *)((long)&defaultComponent->field_2 + 8);
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  }
  else {
    local_40.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  local_40._M_string_length = defaultComponent->_M_string_length;
  (defaultComponent->_M_dataplus)._M_p = (pointer)paVar1;
  defaultComponent->_M_string_length = 0;
  (defaultComponent->field_2)._M_local_buf[0] = '\0';
  cmInstallCommandArguments::cmInstallCommandArguments
            (&this->super_cmInstallCommandArguments,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  (this->FileSet)._M_dataplus._M_p = (pointer)&(this->FileSet).field_2;
  (this->FileSet)._M_string_length = 0;
  (this->FileSet).field_2._M_local_buf[0] = '\0';
  name.super_string_view._M_str = "FILE_SET";
  name.super_string_view._M_len = 8;
  cmArgumentParser<void>::Bind<std::__cxx11::string>
            ((cmArgumentParser<void> *)this,name,&this->FileSet);
  return;
}

Assistant:

cmInstallCommandFileSetArguments::cmInstallCommandFileSetArguments(
  std::string defaultComponent)
  : cmInstallCommandArguments(std::move(defaultComponent))
{
  this->Bind("FILE_SET"_s, this->FileSet);
}